

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackInterpreter.cpp
# Opt level: O1

void __thiscall Lodtalk::StackInterpreter::interpret(StackInterpreter *this)

{
  uint8_t **ppuVar1;
  byte bVar2;
  char cVar3;
  long *plVar4;
  anon_union_8_4_0eb573b0_for_Oop_0 *paVar5;
  uint64_t uVar6;
  undefined8 uVar7;
  ulong uVar8;
  int64_t iVar9;
  uint uVar10;
  long lVar11;
  anon_union_8_4_0eb573b0_for_Oop_0 aVar12;
  uint8_t *puVar13;
  StackMemory *pSVar14;
  CompiledMethod *pCVar15;
  size_t sVar16;
  SpecialMessageSelector SVar17;
  int iVar18;
  undefined8 *puVar19;
  VMContext *pVVar20;
  
  this->extendA = 0;
  this->extendB = 0;
  sVar16 = this->pc;
  do {
    if (sVar16 == 0) {
      return;
    }
    this->currentOpcode = this->nextOpcode;
    switch(this->nextOpcode) {
    case 0:
      pSVar14 = this->stack;
      this->pc = sVar16 + 1;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar16);
      puVar13 = (pSVar14->stackFrame).stackPointer;
      lVar11 = *(long *)(*(long *)((pSVar14->stackFrame).framePointer + -0x20) + 8);
      goto LAB_00146a6e;
    case 1:
      pSVar14 = this->stack;
      this->pc = sVar16 + 1;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar16);
      puVar13 = (pSVar14->stackFrame).stackPointer;
      uVar8 = *(ulong *)((pSVar14->stackFrame).framePointer + -0x20);
      lVar11 = 0;
      if ((uVar8 & 7) == 0) {
        lVar11 = uVar8 + 8;
      }
      lVar11 = *(long *)(lVar11 + 8);
      goto LAB_00146a6e;
    case 2:
      pSVar14 = this->stack;
      this->pc = sVar16 + 1;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar16);
      puVar13 = (pSVar14->stackFrame).stackPointer;
      uVar8 = *(ulong *)((pSVar14->stackFrame).framePointer + -0x20);
      lVar11 = 0;
      if ((uVar8 & 7) == 0) {
        lVar11 = uVar8 + 8;
      }
      lVar11 = *(long *)(lVar11 + 0x10);
      goto LAB_00146a6e;
    case 3:
      pSVar14 = this->stack;
      this->pc = sVar16 + 1;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar16);
      puVar13 = (pSVar14->stackFrame).stackPointer;
      uVar8 = *(ulong *)((pSVar14->stackFrame).framePointer + -0x20);
      lVar11 = 0;
      if ((uVar8 & 7) == 0) {
        lVar11 = uVar8 + 8;
      }
      lVar11 = *(long *)(lVar11 + 0x18);
      goto LAB_00146a6e;
    case 4:
      pSVar14 = this->stack;
      this->pc = sVar16 + 1;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar16);
      puVar13 = (pSVar14->stackFrame).stackPointer;
      uVar8 = *(ulong *)((pSVar14->stackFrame).framePointer + -0x20);
      lVar11 = 0;
      if ((uVar8 & 7) == 0) {
        lVar11 = uVar8 + 8;
      }
      lVar11 = *(long *)(lVar11 + 0x20);
      goto LAB_00146a6e;
    case 5:
      pSVar14 = this->stack;
      this->pc = sVar16 + 1;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar16);
      puVar13 = (pSVar14->stackFrame).stackPointer;
      uVar8 = *(ulong *)((pSVar14->stackFrame).framePointer + -0x20);
      lVar11 = 0;
      if ((uVar8 & 7) == 0) {
        lVar11 = uVar8 + 8;
      }
      lVar11 = *(long *)(lVar11 + 0x28);
      goto LAB_00146a6e;
    case 6:
      pSVar14 = this->stack;
      this->pc = sVar16 + 1;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar16);
      puVar13 = (pSVar14->stackFrame).stackPointer;
      uVar8 = *(ulong *)((pSVar14->stackFrame).framePointer + -0x20);
      lVar11 = 0;
      if ((uVar8 & 7) == 0) {
        lVar11 = uVar8 + 8;
      }
      lVar11 = *(long *)(lVar11 + 0x30);
      goto LAB_00146a6e;
    case 7:
      pSVar14 = this->stack;
      this->pc = sVar16 + 1;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar16);
      puVar13 = (pSVar14->stackFrame).stackPointer;
      uVar8 = *(ulong *)((pSVar14->stackFrame).framePointer + -0x20);
      lVar11 = 0;
      if ((uVar8 & 7) == 0) {
        lVar11 = uVar8 + 8;
      }
      lVar11 = *(long *)(lVar11 + 0x38);
      goto LAB_00146a6e;
    case 8:
      pSVar14 = this->stack;
      this->pc = sVar16 + 1;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar16);
      puVar13 = (pSVar14->stackFrame).stackPointer;
      uVar8 = *(ulong *)((pSVar14->stackFrame).framePointer + -0x20);
      lVar11 = 0;
      if ((uVar8 & 7) == 0) {
        lVar11 = uVar8 + 8;
      }
      lVar11 = *(long *)(lVar11 + 0x40);
      goto LAB_00146a6e;
    case 9:
      pSVar14 = this->stack;
      this->pc = sVar16 + 1;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar16);
      puVar13 = (pSVar14->stackFrame).stackPointer;
      uVar8 = *(ulong *)((pSVar14->stackFrame).framePointer + -0x20);
      lVar11 = 0;
      if ((uVar8 & 7) == 0) {
        lVar11 = uVar8 + 8;
      }
      lVar11 = *(long *)(lVar11 + 0x48);
      goto LAB_00146a6e;
    case 10:
      pSVar14 = this->stack;
      this->pc = sVar16 + 1;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar16);
      puVar13 = (pSVar14->stackFrame).stackPointer;
      uVar8 = *(ulong *)((pSVar14->stackFrame).framePointer + -0x20);
      lVar11 = 0;
      if ((uVar8 & 7) == 0) {
        lVar11 = uVar8 + 8;
      }
      lVar11 = *(long *)(lVar11 + 0x50);
      goto LAB_00146a6e;
    case 0xb:
      pSVar14 = this->stack;
      this->pc = sVar16 + 1;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar16);
      puVar13 = (pSVar14->stackFrame).stackPointer;
      uVar8 = *(ulong *)((pSVar14->stackFrame).framePointer + -0x20);
      lVar11 = 0;
      if ((uVar8 & 7) == 0) {
        lVar11 = uVar8 + 8;
      }
      lVar11 = *(long *)(lVar11 + 0x58);
      goto LAB_00146a6e;
    case 0xc:
      pSVar14 = this->stack;
      this->pc = sVar16 + 1;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar16);
      puVar13 = (pSVar14->stackFrame).stackPointer;
      uVar8 = *(ulong *)((pSVar14->stackFrame).framePointer + -0x20);
      lVar11 = 0;
      if ((uVar8 & 7) == 0) {
        lVar11 = uVar8 + 8;
      }
      lVar11 = *(long *)(lVar11 + 0x60);
      goto LAB_00146a6e;
    case 0xd:
      pSVar14 = this->stack;
      this->pc = sVar16 + 1;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar16);
      puVar13 = (pSVar14->stackFrame).stackPointer;
      uVar8 = *(ulong *)((pSVar14->stackFrame).framePointer + -0x20);
      lVar11 = 0;
      if ((uVar8 & 7) == 0) {
        lVar11 = uVar8 + 8;
      }
      lVar11 = *(long *)(lVar11 + 0x68);
      goto LAB_00146a6e;
    case 0xe:
      pSVar14 = this->stack;
      this->pc = sVar16 + 1;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar16);
      puVar13 = (pSVar14->stackFrame).stackPointer;
      uVar8 = *(ulong *)((pSVar14->stackFrame).framePointer + -0x20);
      lVar11 = 0;
      if ((uVar8 & 7) == 0) {
        lVar11 = uVar8 + 8;
      }
      lVar11 = *(long *)(lVar11 + 0x70);
      goto LAB_00146a6e;
    case 0xf:
      pSVar14 = this->stack;
      this->pc = sVar16 + 1;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar16);
      puVar13 = (pSVar14->stackFrame).stackPointer;
      uVar8 = *(ulong *)((pSVar14->stackFrame).framePointer + -0x20);
      lVar11 = 0;
      if ((uVar8 & 7) == 0) {
        lVar11 = uVar8 + 8;
      }
      lVar11 = *(long *)(lVar11 + 0x78);
      goto LAB_00146a6e;
    case 0x10:
      this->pc = sVar16 + 1;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar16);
      pSVar14 = this->stack;
      aVar12 = (anon_union_8_4_0eb573b0_for_Oop_0)(this->literalArray->field_0).uintValue;
      goto LAB_00146a9b;
    case 0x11:
      this->pc = sVar16 + 1;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar16);
      pSVar14 = this->stack;
      aVar12 = (anon_union_8_4_0eb573b0_for_Oop_0)this->literalArray[1].field_0.uintValue;
      goto LAB_00146a9b;
    case 0x12:
      this->pc = sVar16 + 1;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar16);
      pSVar14 = this->stack;
      aVar12 = (anon_union_8_4_0eb573b0_for_Oop_0)this->literalArray[2].field_0.uintValue;
      goto LAB_00146a9b;
    case 0x13:
      this->pc = sVar16 + 1;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar16);
      pSVar14 = this->stack;
      aVar12 = (anon_union_8_4_0eb573b0_for_Oop_0)this->literalArray[3].field_0.uintValue;
      goto LAB_00146a9b;
    case 0x14:
      this->pc = sVar16 + 1;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar16);
      pSVar14 = this->stack;
      aVar12 = (anon_union_8_4_0eb573b0_for_Oop_0)this->literalArray[4].field_0.uintValue;
      goto LAB_00146a9b;
    case 0x15:
      this->pc = sVar16 + 1;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar16);
      pSVar14 = this->stack;
      aVar12 = (anon_union_8_4_0eb573b0_for_Oop_0)this->literalArray[5].field_0.uintValue;
      goto LAB_00146a9b;
    case 0x16:
      this->pc = sVar16 + 1;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar16);
      pSVar14 = this->stack;
      aVar12 = (anon_union_8_4_0eb573b0_for_Oop_0)this->literalArray[6].field_0.uintValue;
      goto LAB_00146a9b;
    case 0x17:
      this->pc = sVar16 + 1;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar16);
      pSVar14 = this->stack;
      aVar12 = (anon_union_8_4_0eb573b0_for_Oop_0)this->literalArray[7].field_0.uintValue;
      goto LAB_00146a9b;
    case 0x18:
      this->pc = sVar16 + 1;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar16);
      pSVar14 = this->stack;
      aVar12 = (anon_union_8_4_0eb573b0_for_Oop_0)this->literalArray[8].field_0.uintValue;
      goto LAB_00146a9b;
    case 0x19:
      this->pc = sVar16 + 1;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar16);
      pSVar14 = this->stack;
      aVar12 = (anon_union_8_4_0eb573b0_for_Oop_0)this->literalArray[9].field_0.uintValue;
      goto LAB_00146a9b;
    case 0x1a:
      this->pc = sVar16 + 1;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar16);
      pSVar14 = this->stack;
      aVar12 = (anon_union_8_4_0eb573b0_for_Oop_0)this->literalArray[10].field_0.uintValue;
      goto LAB_00146a9b;
    case 0x1b:
      this->pc = sVar16 + 1;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar16);
      pSVar14 = this->stack;
      aVar12 = (anon_union_8_4_0eb573b0_for_Oop_0)this->literalArray[0xb].field_0.uintValue;
      goto LAB_00146a9b;
    case 0x1c:
      this->pc = sVar16 + 1;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar16);
      pSVar14 = this->stack;
      aVar12 = (anon_union_8_4_0eb573b0_for_Oop_0)this->literalArray[0xc].field_0.uintValue;
      goto LAB_00146a9b;
    case 0x1d:
      this->pc = sVar16 + 1;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar16);
      pSVar14 = this->stack;
      aVar12 = (anon_union_8_4_0eb573b0_for_Oop_0)this->literalArray[0xd].field_0.uintValue;
      goto LAB_00146a9b;
    case 0x1e:
      this->pc = sVar16 + 1;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar16);
      pSVar14 = this->stack;
      aVar12 = (anon_union_8_4_0eb573b0_for_Oop_0)this->literalArray[0xe].field_0.uintValue;
      goto LAB_00146a9b;
    case 0x1f:
      this->pc = sVar16 + 1;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar16);
      pSVar14 = this->stack;
      aVar12 = (anon_union_8_4_0eb573b0_for_Oop_0)this->literalArray[0xf].field_0.uintValue;
      goto LAB_00146a9b;
    case 0x20:
      this->pc = sVar16 + 1;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar16);
      pSVar14 = this->stack;
      aVar12 = this->literalArray->field_0;
      goto LAB_00146a9f;
    case 0x21:
      this->pc = sVar16 + 1;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar16);
      pSVar14 = this->stack;
      aVar12 = this->literalArray[1].field_0;
      goto LAB_00146a9f;
    case 0x22:
      this->pc = sVar16 + 1;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar16);
      pSVar14 = this->stack;
      aVar12 = (anon_union_8_4_0eb573b0_for_Oop_0)this->literalArray;
LAB_00146a9b:
      aVar12 = *(anon_union_8_4_0eb573b0_for_Oop_0 *)(aVar12.uintValue + 0x10);
      goto LAB_00146a9f;
    case 0x23:
      this->pc = sVar16 + 1;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar16);
      pSVar14 = this->stack;
      aVar12 = this->literalArray[3].field_0;
      goto LAB_00146a9f;
    case 0x24:
      this->pc = sVar16 + 1;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar16);
      pSVar14 = this->stack;
      aVar12 = this->literalArray[4].field_0;
      goto LAB_00146a9f;
    case 0x25:
      this->pc = sVar16 + 1;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar16);
      pSVar14 = this->stack;
      aVar12 = this->literalArray[5].field_0;
      goto LAB_00146a9f;
    case 0x26:
      this->pc = sVar16 + 1;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar16);
      pSVar14 = this->stack;
      aVar12 = this->literalArray[6].field_0;
      goto LAB_00146a9f;
    case 0x27:
      this->pc = sVar16 + 1;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar16);
      pSVar14 = this->stack;
      aVar12 = this->literalArray[7].field_0;
      goto LAB_00146a9f;
    case 0x28:
      this->pc = sVar16 + 1;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar16);
      pSVar14 = this->stack;
      aVar12 = this->literalArray[8].field_0;
      goto LAB_00146a9f;
    case 0x29:
      this->pc = sVar16 + 1;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar16);
      pSVar14 = this->stack;
      aVar12 = this->literalArray[9].field_0;
      goto LAB_00146a9f;
    case 0x2a:
      this->pc = sVar16 + 1;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar16);
      pSVar14 = this->stack;
      aVar12 = this->literalArray[10].field_0;
      goto LAB_00146a9f;
    case 0x2b:
      this->pc = sVar16 + 1;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar16);
      pSVar14 = this->stack;
      aVar12 = this->literalArray[0xb].field_0;
      goto LAB_00146a9f;
    case 0x2c:
      this->pc = sVar16 + 1;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar16);
      pSVar14 = this->stack;
      aVar12 = this->literalArray[0xc].field_0;
      goto LAB_00146a9f;
    case 0x2d:
      this->pc = sVar16 + 1;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar16);
      pSVar14 = this->stack;
      aVar12 = this->literalArray[0xd].field_0;
      goto LAB_00146a9f;
    case 0x2e:
      this->pc = sVar16 + 1;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar16);
      pSVar14 = this->stack;
      aVar12 = this->literalArray[0xe].field_0;
      goto LAB_00146a9f;
    case 0x2f:
      this->pc = sVar16 + 1;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar16);
      pSVar14 = this->stack;
      aVar12 = this->literalArray[0xf].field_0;
      goto LAB_00146a9f;
    case 0x30:
      this->pc = sVar16 + 1;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar16);
      pSVar14 = this->stack;
      aVar12 = this->literalArray[0x10].field_0;
      goto LAB_00146a9f;
    case 0x31:
      this->pc = sVar16 + 1;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar16);
      pSVar14 = this->stack;
      aVar12 = this->literalArray[0x11].field_0;
      goto LAB_00146a9f;
    case 0x32:
      this->pc = sVar16 + 1;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar16);
      pSVar14 = this->stack;
      aVar12 = this->literalArray[0x12].field_0;
      goto LAB_00146a9f;
    case 0x33:
      this->pc = sVar16 + 1;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar16);
      pSVar14 = this->stack;
      aVar12 = this->literalArray[0x13].field_0;
      goto LAB_00146a9f;
    case 0x34:
      this->pc = sVar16 + 1;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar16);
      pSVar14 = this->stack;
      aVar12 = this->literalArray[0x14].field_0;
      goto LAB_00146a9f;
    case 0x35:
      this->pc = sVar16 + 1;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar16);
      pSVar14 = this->stack;
      aVar12 = this->literalArray[0x15].field_0;
      goto LAB_00146a9f;
    case 0x36:
      this->pc = sVar16 + 1;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar16);
      pSVar14 = this->stack;
      aVar12 = this->literalArray[0x16].field_0;
      goto LAB_00146a9f;
    case 0x37:
      this->pc = sVar16 + 1;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar16);
      pSVar14 = this->stack;
      aVar12 = this->literalArray[0x17].field_0;
      goto LAB_00146a9f;
    case 0x38:
      this->pc = sVar16 + 1;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar16);
      pSVar14 = this->stack;
      aVar12 = this->literalArray[0x18].field_0;
      goto LAB_00146a9f;
    case 0x39:
      this->pc = sVar16 + 1;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar16);
      pSVar14 = this->stack;
      aVar12 = this->literalArray[0x19].field_0;
      goto LAB_00146a9f;
    case 0x3a:
      this->pc = sVar16 + 1;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar16);
      pSVar14 = this->stack;
      aVar12 = this->literalArray[0x1a].field_0;
      goto LAB_00146a9f;
    case 0x3b:
      this->pc = sVar16 + 1;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar16);
      pSVar14 = this->stack;
      aVar12 = this->literalArray[0x1b].field_0;
      goto LAB_00146a9f;
    case 0x3c:
      this->pc = sVar16 + 1;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar16);
      pSVar14 = this->stack;
      aVar12 = this->literalArray[0x1c].field_0;
      goto LAB_00146a9f;
    case 0x3d:
      this->pc = sVar16 + 1;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar16);
      pSVar14 = this->stack;
      aVar12 = this->literalArray[0x1d].field_0;
      goto LAB_00146a9f;
    case 0x3e:
      this->pc = sVar16 + 1;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar16);
      pSVar14 = this->stack;
      aVar12 = this->literalArray[0x1e].field_0;
      goto LAB_00146a9f;
    case 0x3f:
      this->pc = sVar16 + 1;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar16);
      pSVar14 = this->stack;
      aVar12 = this->literalArray[0x1f].field_0;
LAB_00146a9f:
      puVar13 = (pSVar14->stackFrame).stackPointer;
      (pSVar14->stackFrame).stackPointer = puVar13 + -8;
      *(anon_union_8_4_0eb573b0_for_Oop_0 *)(puVar13 + -8) = aVar12;
      break;
    case 0x40:
      iVar18 = 0;
      goto LAB_001468f5;
    case 0x41:
      iVar18 = 1;
      goto LAB_001468f5;
    case 0x42:
      iVar18 = 2;
      goto LAB_001468f5;
    case 0x43:
      iVar18 = 3;
      goto LAB_001468f5;
    case 0x44:
      iVar18 = 4;
      goto LAB_001468f5;
    case 0x45:
      iVar18 = 5;
      goto LAB_001468f5;
    case 0x46:
      iVar18 = 6;
      goto LAB_001468f5;
    case 0x47:
      iVar18 = 7;
      goto LAB_001468f5;
    case 0x48:
      iVar18 = 8;
      goto LAB_001468f5;
    case 0x49:
      iVar18 = 9;
      goto LAB_001468f5;
    case 0x4a:
      iVar18 = 10;
      goto LAB_001468f5;
    case 0x4b:
      iVar18 = 0xb;
LAB_001468f5:
      interpretPushTempShort(this,iVar18);
      break;
    case 0x4c:
      pSVar14 = this->stack;
      this->pc = sVar16 + 1;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar16);
      puVar13 = (pSVar14->stackFrame).stackPointer;
      lVar11 = *(long *)((pSVar14->stackFrame).framePointer + -0x20);
      goto LAB_00146a6e;
    case 0x4d:
      this->pc = sVar16 + 1;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar16);
      puVar13 = (this->stack->stackFrame).stackPointer;
      (this->stack->stackFrame).stackPointer = puVar13 + -8;
      puVar19 = &TrueObject;
      goto LAB_001468e4;
    case 0x4e:
      this->pc = sVar16 + 1;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar16);
      puVar13 = (this->stack->stackFrame).stackPointer;
      (this->stack->stackFrame).stackPointer = puVar13 + -8;
      puVar19 = &FalseObject;
      goto LAB_001468e4;
    case 0x4f:
      this->pc = sVar16 + 1;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar16);
      puVar13 = (this->stack->stackFrame).stackPointer;
      (this->stack->stackFrame).stackPointer = puVar13 + -8;
      puVar19 = &NilObject;
LAB_001468e4:
      *(undefined8 **)(puVar13 + -8) = puVar19;
      break;
    case 0x50:
      this->pc = sVar16 + 1;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar16);
      puVar13 = (this->stack->stackFrame).stackPointer;
      (this->stack->stackFrame).stackPointer = puVar13 + -8;
      puVar13[-8] = '\x01';
      puVar13[-7] = '\0';
      puVar13[-6] = '\0';
      puVar13[-5] = '\0';
      puVar13[-4] = '\0';
      puVar13[-3] = '\0';
      puVar13[-2] = '\0';
      puVar13[-1] = '\0';
      break;
    case 0x51:
      this->pc = sVar16 + 1;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar16);
      puVar13 = (this->stack->stackFrame).stackPointer;
      (this->stack->stackFrame).stackPointer = puVar13 + -8;
      puVar13[-8] = '\x03';
      puVar13[-7] = '\0';
      puVar13[-6] = '\0';
      puVar13[-5] = '\0';
      puVar13[-4] = '\0';
      puVar13[-3] = '\0';
      puVar13[-2] = '\0';
      puVar13[-1] = '\0';
      break;
    case 0x52:
      interpretPushThisContext(this);
      break;
    case 0x53:
      this->pc = sVar16 + 1;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar16);
      puVar13 = (this->stack->stackFrame).stackPointer;
      uVar7 = *(undefined8 *)puVar13;
      (this->stack->stackFrame).stackPointer = puVar13 + -8;
      *(undefined8 *)(puVar13 + -8) = uVar7;
      break;
    default:
      errorFormat(this,"unsupported bytecode %d");
      break;
    case 0x58:
      aVar12 = *(anon_union_8_4_0eb573b0_for_Oop_0 *)
                ((this->stack->stackFrame).framePointer + -0x20);
      goto LAB_001467f0;
    case 0x59:
      aVar12.pointer = (uint8_t *)&TrueObject;
      goto LAB_001467f0;
    case 0x5a:
      aVar12.pointer = (uint8_t *)&FalseObject;
      goto LAB_001467f0;
    case 0x5b:
      aVar12.pointer = (uint8_t *)&NilObject;
      goto LAB_001467f0;
    case 0x5c:
      paVar5 = (anon_union_8_4_0eb573b0_for_Oop_0 *)(this->stack->stackFrame).stackPointer;
      aVar12 = *paVar5;
      (this->stack->stackFrame).stackPointer = (uint8_t *)(paVar5 + 1);
LAB_001467f0:
      returnValue(this,(Oop)aVar12);
      break;
    case 0x5d:
      aVar12.pointer = (uint8_t *)&NilObject;
      goto LAB_00145dc5;
    case 0x5e:
      paVar5 = (anon_union_8_4_0eb573b0_for_Oop_0 *)(this->stack->stackFrame).stackPointer;
      aVar12 = *paVar5;
      (this->stack->stackFrame).stackPointer = (uint8_t *)(paVar5 + 1);
LAB_00145dc5:
      localReturnValue(this,(Oop)aVar12);
      break;
    case 0x5f:
      this->pc = sVar16 + 1;
      uVar10 = (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                      super_SequenceableCollection.super_Collection.super_Object.
                                      super_ProtoObject.object_header_ + sVar16);
      goto LAB_0014668d;
    case 0x60:
      interpretSpecialMessageAdd(this);
      break;
    case 0x61:
      interpretSpecialMessageMinus(this);
      break;
    case 0x62:
      interpretSpecialMessageLessThan(this);
      break;
    case 99:
      interpretSpecialMessageGreaterThan(this);
      break;
    case 100:
      interpretSpecialMessageLessEqual(this);
      break;
    case 0x65:
      interpretSpecialMessageGreaterEqual(this);
      break;
    case 0x66:
      interpretSpecialMessageEqual(this);
      break;
    case 0x67:
      interpretSpecialMessageNotEqual(this);
      break;
    case 0x68:
      interpretSpecialMessageMultiply(this);
      break;
    case 0x69:
      interpretSpecialMessageDivide(this);
      break;
    case 0x6a:
      interpretSpecialMessageRemainder(this);
      break;
    case 0x6b:
      pVVar20 = this->context;
      SVar17 = MakePoint;
      goto LAB_00146634;
    case 0x6c:
      interpretSpecialMessageBitShift(this);
      break;
    case 0x6d:
      interpretSpecialMessageIntegerDivision(this);
      break;
    case 0x6e:
      interpretSpecialMessageBitAnd(this);
      break;
    case 0x6f:
      interpretSpecialMessageBitOr(this);
      break;
    case 0x70:
      pVVar20 = this->context;
      SVar17 = At;
      goto LAB_00146634;
    case 0x71:
      aVar12 = (anon_union_8_4_0eb573b0_for_Oop_0)
               VMContext::getSpecialMessageSelector(this->context,AtPut);
      sVar16 = 2;
      goto LAB_00146759;
    case 0x72:
      pVVar20 = this->context;
      SVar17 = Size;
      goto LAB_0014674c;
    case 0x73:
      pVVar20 = this->context;
      SVar17 = Next;
      goto LAB_0014674c;
    case 0x74:
      pVVar20 = this->context;
      SVar17 = NextPut;
      goto LAB_00146634;
    case 0x75:
      pVVar20 = this->context;
      SVar17 = AtEnd;
      goto LAB_0014674c;
    case 0x76:
      pSVar14 = this->stack;
      this->pc = sVar16 + 1;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar16);
      plVar4 = (long *)(pSVar14->stackFrame).stackPointer;
      lVar11 = *plVar4;
      (pSVar14->stackFrame).stackPointer = (uint8_t *)(plVar4 + 1);
      if (plVar4[1] == lVar11) {
        puVar19 = &TrueObject;
      }
      else {
        puVar19 = &FalseObject;
      }
      (pSVar14->stackFrame).stackPointer = (uint8_t *)(plVar4 + 1);
      plVar4[1] = (long)puVar19;
      break;
    case 0x77:
      interpretSpecialMessageClass(this);
      break;
    case 0x79:
      pVVar20 = this->context;
      SVar17 = Value;
      goto LAB_0014674c;
    case 0x7a:
      pVVar20 = this->context;
      SVar17 = ValueArg;
      goto LAB_00146634;
    case 0x7b:
      pVVar20 = this->context;
      SVar17 = Do;
      goto LAB_00146634;
    case 0x7c:
      pVVar20 = this->context;
      SVar17 = New;
      goto LAB_0014674c;
    case 0x7d:
      pVVar20 = this->context;
      SVar17 = NewArray;
LAB_00146634:
      aVar12 = (anon_union_8_4_0eb573b0_for_Oop_0)
               VMContext::getSpecialMessageSelector(pVVar20,SVar17);
      sVar16 = 1;
      goto LAB_00146759;
    case 0x7e:
      pVVar20 = this->context;
      SVar17 = X;
      goto LAB_0014674c;
    case 0x7f:
      pVVar20 = this->context;
      SVar17 = Y;
LAB_0014674c:
      aVar12 = (anon_union_8_4_0eb573b0_for_Oop_0)
               VMContext::getSpecialMessageSelector(pVVar20,SVar17);
      goto LAB_00146757;
    case 0x80:
      aVar12 = this->literalArray->field_0;
      goto LAB_00146757;
    case 0x81:
      aVar12 = this->literalArray[1].field_0;
      goto LAB_00146757;
    case 0x82:
      aVar12 = this->literalArray[2].field_0;
      goto LAB_00146757;
    case 0x83:
      aVar12 = this->literalArray[3].field_0;
      goto LAB_00146757;
    case 0x84:
      aVar12 = this->literalArray[4].field_0;
      goto LAB_00146757;
    case 0x85:
      aVar12 = this->literalArray[5].field_0;
      goto LAB_00146757;
    case 0x86:
      aVar12 = this->literalArray[6].field_0;
      goto LAB_00146757;
    case 0x87:
      aVar12 = this->literalArray[7].field_0;
      goto LAB_00146757;
    case 0x88:
      aVar12 = this->literalArray[8].field_0;
      goto LAB_00146757;
    case 0x89:
      aVar12 = this->literalArray[9].field_0;
      goto LAB_00146757;
    case 0x8a:
      aVar12 = this->literalArray[10].field_0;
      goto LAB_00146757;
    case 0x8b:
      aVar12 = this->literalArray[0xb].field_0;
      goto LAB_00146757;
    case 0x8c:
      aVar12 = this->literalArray[0xc].field_0;
      goto LAB_00146757;
    case 0x8d:
      aVar12 = this->literalArray[0xd].field_0;
      goto LAB_00146757;
    case 0x8e:
      aVar12 = this->literalArray[0xe].field_0;
      goto LAB_00146757;
    case 0x8f:
      aVar12 = this->literalArray[0xf].field_0;
LAB_00146757:
      sVar16 = 0;
LAB_00146759:
      sendSelectorArgumentCount(this,(Oop)aVar12,sVar16,false);
      break;
    case 0x90:
      aVar12 = this->literalArray->field_0;
      goto LAB_00146730;
    case 0x91:
      aVar12 = this->literalArray[1].field_0;
      goto LAB_00146730;
    case 0x92:
      aVar12 = this->literalArray[2].field_0;
      goto LAB_00146730;
    case 0x93:
      aVar12 = this->literalArray[3].field_0;
      goto LAB_00146730;
    case 0x94:
      aVar12 = this->literalArray[4].field_0;
      goto LAB_00146730;
    case 0x95:
      aVar12 = this->literalArray[5].field_0;
      goto LAB_00146730;
    case 0x96:
      aVar12 = this->literalArray[6].field_0;
      goto LAB_00146730;
    case 0x97:
      aVar12 = this->literalArray[7].field_0;
      goto LAB_00146730;
    case 0x98:
      aVar12 = this->literalArray[8].field_0;
      goto LAB_00146730;
    case 0x99:
      aVar12 = this->literalArray[9].field_0;
      goto LAB_00146730;
    case 0x9a:
      aVar12 = this->literalArray[10].field_0;
      goto LAB_00146730;
    case 0x9b:
      aVar12 = this->literalArray[0xb].field_0;
      goto LAB_00146730;
    case 0x9c:
      aVar12 = this->literalArray[0xc].field_0;
      goto LAB_00146730;
    case 0x9d:
      aVar12 = this->literalArray[0xd].field_0;
      goto LAB_00146730;
    case 0x9e:
      aVar12 = this->literalArray[0xe].field_0;
      goto LAB_00146730;
    case 0x9f:
      aVar12 = this->literalArray[0xf].field_0;
LAB_00146730:
      sVar16 = 1;
      goto LAB_00146759;
    case 0xa0:
      aVar12 = this->literalArray->field_0;
      goto LAB_001465d9;
    case 0xa1:
      aVar12 = this->literalArray[1].field_0;
      goto LAB_001465d9;
    case 0xa2:
      aVar12 = this->literalArray[2].field_0;
      goto LAB_001465d9;
    case 0xa3:
      aVar12 = this->literalArray[3].field_0;
      goto LAB_001465d9;
    case 0xa4:
      aVar12 = this->literalArray[4].field_0;
      goto LAB_001465d9;
    case 0xa5:
      aVar12 = this->literalArray[5].field_0;
      goto LAB_001465d9;
    case 0xa6:
      aVar12 = this->literalArray[6].field_0;
      goto LAB_001465d9;
    case 0xa7:
      aVar12 = this->literalArray[7].field_0;
      goto LAB_001465d9;
    case 0xa8:
      aVar12 = this->literalArray[8].field_0;
      goto LAB_001465d9;
    case 0xa9:
      aVar12 = this->literalArray[9].field_0;
      goto LAB_001465d9;
    case 0xaa:
      aVar12 = this->literalArray[10].field_0;
      goto LAB_001465d9;
    case 0xab:
      aVar12 = this->literalArray[0xb].field_0;
      goto LAB_001465d9;
    case 0xac:
      aVar12 = this->literalArray[0xc].field_0;
      goto LAB_001465d9;
    case 0xad:
      aVar12 = this->literalArray[0xd].field_0;
      goto LAB_001465d9;
    case 0xae:
      aVar12 = this->literalArray[0xe].field_0;
      goto LAB_001465d9;
    case 0xaf:
      aVar12 = this->literalArray[0xf].field_0;
LAB_001465d9:
      sVar16 = 2;
      goto LAB_00146759;
    case 0xb0:
      this->pc = sVar16 + 2;
      uVar10 = (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                      super_SequenceableCollection.super_Collection.super_Object.
                                      super_ProtoObject.object_header_ + sVar16 + 1);
      goto LAB_0014668d;
    case 0xb1:
      this->pc = sVar16 + 3;
      uVar10 = (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                      super_SequenceableCollection.super_Collection.super_Object.
                                      super_ProtoObject.object_header_ + sVar16 + 2);
      goto LAB_0014668d;
    case 0xb2:
      this->pc = sVar16 + 4;
      uVar10 = (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                      super_SequenceableCollection.super_Collection.super_Object.
                                      super_ProtoObject.object_header_ + sVar16 + 3);
      goto LAB_0014668d;
    case 0xb3:
      this->pc = sVar16 + 5;
      uVar10 = (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                      super_SequenceableCollection.super_Collection.super_Object.
                                      super_ProtoObject.object_header_ + sVar16 + 4);
      goto LAB_0014668d;
    case 0xb4:
      this->pc = sVar16 + 6;
      uVar10 = (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                      super_SequenceableCollection.super_Collection.super_Object.
                                      super_ProtoObject.object_header_ + sVar16 + 5);
      goto LAB_0014668d;
    case 0xb5:
      this->pc = sVar16 + 7;
      uVar10 = (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                      super_SequenceableCollection.super_Collection.super_Object.
                                      super_ProtoObject.object_header_ + sVar16 + 6);
      goto LAB_0014668d;
    case 0xb6:
      this->pc = sVar16 + 8;
      uVar10 = (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                      super_SequenceableCollection.super_Collection.super_Object.
                                      super_ProtoObject.object_header_ + sVar16 + 7);
      goto LAB_0014668d;
    case 0xb7:
      this->pc = sVar16 + 9;
      uVar10 = (uint)*(byte *)((long)&this->method[1].super_ByteArray.super_ArrayedCollection.
                                      super_SequenceableCollection.super_Collection.super_Object.
                                      super_ProtoObject.object_header_ + sVar16);
      goto LAB_0014668d;
    case 0xb8:
      iVar18 = 0;
      goto LAB_001464e3;
    case 0xb9:
      iVar18 = 1;
      goto LAB_001464e3;
    case 0xba:
      iVar18 = 2;
      goto LAB_001464e3;
    case 0xbb:
      iVar18 = 3;
      goto LAB_001464e3;
    case 0xbc:
      iVar18 = 4;
      goto LAB_001464e3;
    case 0xbd:
      iVar18 = 5;
      goto LAB_001464e3;
    case 0xbe:
      iVar18 = 6;
      goto LAB_001464e3;
    case 0xbf:
      iVar18 = 7;
LAB_001464e3:
      interpretJumpOnTrueShort(this,iVar18);
      break;
    case 0xc0:
      iVar18 = 0;
      goto LAB_00146490;
    case 0xc1:
      iVar18 = 1;
      goto LAB_00146490;
    case 0xc2:
      iVar18 = 2;
      goto LAB_00146490;
    case 0xc3:
      iVar18 = 3;
      goto LAB_00146490;
    case 0xc4:
      iVar18 = 4;
      goto LAB_00146490;
    case 0xc5:
      iVar18 = 5;
      goto LAB_00146490;
    case 0xc6:
      iVar18 = 6;
      goto LAB_00146490;
    case 199:
      iVar18 = 7;
LAB_00146490:
      interpretJumpOnFalseShort(this,iVar18);
      break;
    case 200:
      pSVar14 = this->stack;
      this->pc = sVar16 + 1;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar16);
      puVar13 = (pSVar14->stackFrame).stackPointer;
      uVar7 = *(undefined8 *)puVar13;
      (pSVar14->stackFrame).stackPointer = puVar13 + 8;
      uVar8 = *(ulong *)((pSVar14->stackFrame).framePointer + -0x20);
      puVar19 = (undefined8 *)0x0;
      if ((uVar8 & 7) == 0) {
        puVar19 = (undefined8 *)(uVar8 + 8);
      }
      *puVar19 = uVar7;
      break;
    case 0xc9:
      pSVar14 = this->stack;
      this->pc = sVar16 + 1;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar16);
      puVar13 = (pSVar14->stackFrame).stackPointer;
      uVar7 = *(undefined8 *)puVar13;
      (pSVar14->stackFrame).stackPointer = puVar13 + 8;
      uVar8 = *(ulong *)((pSVar14->stackFrame).framePointer + -0x20);
      lVar11 = 0;
      if ((uVar8 & 7) == 0) {
        lVar11 = uVar8 + 8;
      }
      *(undefined8 *)(lVar11 + 8) = uVar7;
      break;
    case 0xca:
      pSVar14 = this->stack;
      this->pc = sVar16 + 1;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar16);
      puVar13 = (pSVar14->stackFrame).stackPointer;
      uVar7 = *(undefined8 *)puVar13;
      (pSVar14->stackFrame).stackPointer = puVar13 + 8;
      uVar8 = *(ulong *)((pSVar14->stackFrame).framePointer + -0x20);
      lVar11 = 0;
      if ((uVar8 & 7) == 0) {
        lVar11 = uVar8 + 8;
      }
      *(undefined8 *)(lVar11 + 0x10) = uVar7;
      break;
    case 0xcb:
      pSVar14 = this->stack;
      this->pc = sVar16 + 1;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar16);
      puVar13 = (pSVar14->stackFrame).stackPointer;
      uVar7 = *(undefined8 *)puVar13;
      (pSVar14->stackFrame).stackPointer = puVar13 + 8;
      uVar8 = *(ulong *)((pSVar14->stackFrame).framePointer + -0x20);
      lVar11 = 0;
      if ((uVar8 & 7) == 0) {
        lVar11 = uVar8 + 8;
      }
      *(undefined8 *)(lVar11 + 0x18) = uVar7;
      break;
    case 0xcc:
      pSVar14 = this->stack;
      this->pc = sVar16 + 1;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar16);
      puVar13 = (pSVar14->stackFrame).stackPointer;
      uVar7 = *(undefined8 *)puVar13;
      (pSVar14->stackFrame).stackPointer = puVar13 + 8;
      uVar8 = *(ulong *)((pSVar14->stackFrame).framePointer + -0x20);
      lVar11 = 0;
      if ((uVar8 & 7) == 0) {
        lVar11 = uVar8 + 8;
      }
      *(undefined8 *)(lVar11 + 0x20) = uVar7;
      break;
    case 0xcd:
      pSVar14 = this->stack;
      this->pc = sVar16 + 1;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar16);
      puVar13 = (pSVar14->stackFrame).stackPointer;
      uVar7 = *(undefined8 *)puVar13;
      (pSVar14->stackFrame).stackPointer = puVar13 + 8;
      uVar8 = *(ulong *)((pSVar14->stackFrame).framePointer + -0x20);
      lVar11 = 0;
      if ((uVar8 & 7) == 0) {
        lVar11 = uVar8 + 8;
      }
      *(undefined8 *)(lVar11 + 0x28) = uVar7;
      break;
    case 0xce:
      pSVar14 = this->stack;
      this->pc = sVar16 + 1;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar16);
      puVar13 = (pSVar14->stackFrame).stackPointer;
      uVar7 = *(undefined8 *)puVar13;
      (pSVar14->stackFrame).stackPointer = puVar13 + 8;
      uVar8 = *(ulong *)((pSVar14->stackFrame).framePointer + -0x20);
      lVar11 = 0;
      if ((uVar8 & 7) == 0) {
        lVar11 = uVar8 + 8;
      }
      *(undefined8 *)(lVar11 + 0x30) = uVar7;
      break;
    case 0xcf:
      pSVar14 = this->stack;
      this->pc = sVar16 + 1;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar16);
      puVar13 = (pSVar14->stackFrame).stackPointer;
      uVar7 = *(undefined8 *)puVar13;
      (pSVar14->stackFrame).stackPointer = puVar13 + 8;
      uVar8 = *(ulong *)((pSVar14->stackFrame).framePointer + -0x20);
      lVar11 = 0;
      if ((uVar8 & 7) == 0) {
        lVar11 = uVar8 + 8;
      }
      *(undefined8 *)(lVar11 + 0x38) = uVar7;
      break;
    case 0xd0:
      iVar18 = 0;
      goto LAB_00146390;
    case 0xd1:
      iVar18 = 1;
      goto LAB_00146390;
    case 0xd2:
      iVar18 = 2;
      goto LAB_00146390;
    case 0xd3:
      iVar18 = 3;
      goto LAB_00146390;
    case 0xd4:
      iVar18 = 4;
      goto LAB_00146390;
    case 0xd5:
      iVar18 = 5;
      goto LAB_00146390;
    case 0xd6:
      iVar18 = 6;
      goto LAB_00146390;
    case 0xd7:
      iVar18 = 7;
LAB_00146390:
      interpretPopStoreTemporalVariableShort(this,iVar18);
      break;
    case 0xd8:
      this->pc = sVar16 + 1;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar16);
      ppuVar1 = &(this->stack->stackFrame).stackPointer;
      *ppuVar1 = *ppuVar1 + 8;
      break;
    case 0xe0:
      pCVar15 = this->method;
      this->pc = sVar16 + 1;
      this->extendA =
           (ulong)*(byte *)((long)&(pCVar15->super_ByteArray).super_ArrayedCollection.
                                   super_SequenceableCollection.super_Collection.super_Object.
                                   super_ProtoObject.object_header_ + sVar16) | this->extendA << 8;
      goto LAB_001460cd;
    case 0xe1:
      pCVar15 = this->method;
      this->pc = sVar16 + 1;
      this->extendB =
           (long)*(char *)((long)&(pCVar15->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar16) + this->extendB * 0x100
      ;
LAB_001460cd:
      this->pc = sVar16 + 2;
      uVar10 = (uint)*(byte *)((long)&(pCVar15->super_ByteArray).super_ArrayedCollection.
                                      super_SequenceableCollection.super_Collection.super_Object.
                                      super_ProtoObject.object_header_ + sVar16 + 1);
LAB_0014668d:
      this->nextOpcode = uVar10;
      break;
    case 0xe2:
      uVar6 = this->extendA;
      this->pc = sVar16 + 1;
      bVar2 = *(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                               super_SequenceableCollection.super_Collection.super_Object.
                               super_ProtoObject.object_header_ + sVar16);
      this->pc = sVar16 + 2;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar16 + 1);
      this->extendA = 0;
      pushLongReceiverVariable(this,uVar6 << 8 | (ulong)bVar2);
      break;
    case 0xe3:
      this->pc = sVar16 + 1;
      bVar2 = *(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                               super_SequenceableCollection.super_Collection.super_Object.
                               super_ProtoObject.object_header_ + sVar16);
      pSVar14 = this->stack;
      uVar6 = this->extendA;
      this->pc = sVar16 + 2;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar16 + 1);
      this->extendA = 0;
      aVar12 = *(anon_union_8_4_0eb573b0_for_Oop_0 *)
                (this->literalArray[(ulong)bVar2 + uVar6 * 0x100].field_0.uintValue + 0x10);
      goto LAB_0014627b;
    case 0xe4:
      this->pc = sVar16 + 1;
      bVar2 = *(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                               super_SequenceableCollection.super_Collection.super_Object.
                               super_ProtoObject.object_header_ + sVar16);
      pSVar14 = this->stack;
      uVar6 = this->extendA;
      this->pc = sVar16 + 2;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar16 + 1);
      this->extendA = 0;
      aVar12 = this->literalArray[(ulong)bVar2 + uVar6 * 0x100].field_0;
LAB_0014627b:
      puVar13 = (pSVar14->stackFrame).stackPointer;
      (pSVar14->stackFrame).stackPointer = puVar13 + -8;
      *(anon_union_8_4_0eb573b0_for_Oop_0 *)(puVar13 + -8) = aVar12;
      break;
    case 0xe5:
      interpretPushTemporary(this);
      break;
    case 0xe6:
      interpretPushNTemps(this);
      break;
    case 0xe7:
      interpretPushInteger(this);
      break;
    case 0xe8:
      this->pc = sVar16 + 1;
      cVar3 = *(char *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                               super_SequenceableCollection.super_Collection.super_Object.
                               super_ProtoObject.object_header_ + sVar16);
      iVar9 = this->extendB;
      this->pc = sVar16 + 2;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar16 + 1);
      this->extendB = 0;
      lVar11 = (long)((int)iVar9 * 0x800 + cVar3 * 8 + 2);
      pSVar14 = this->stack;
      puVar13 = (pSVar14->stackFrame).stackPointer;
LAB_00146a6e:
      (pSVar14->stackFrame).stackPointer = puVar13 + -8;
      *(long *)(puVar13 + -8) = lVar11;
      break;
    case 0xe9:
      interpretPushArrayWithElements(this);
      break;
    case 0xea:
      interpretSend(this);
      break;
    case 0xeb:
      interpretSuperSend(this);
      break;
    case 0xed:
      interpretJump(this);
      break;
    case 0xee:
      interpretJumpOnTrue(this);
      break;
    case 0xef:
      interpretJumpOnFalse(this);
      break;
    case 0xf1:
      interpret();
    case 0xf0:
      interpret();
    case 0xec:
      interpret();
    case 0xf2:
      interpretPopStoreTemporalVariable(this);
      break;
    case 0xf3:
      interpretStoreReceiverVariable(this);
      break;
    case 0xf4:
      this->pc = sVar16 + 1;
      bVar2 = *(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                               super_SequenceableCollection.super_Collection.super_Object.
                               super_ProtoObject.object_header_ + sVar16);
      uVar6 = this->extendA;
      this->pc = sVar16 + 2;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar16 + 1);
      this->extendA = 0;
      *(undefined8 *)(this->literalArray[(ulong)bVar2 + uVar6 * 0x100].field_0.uintValue + 0x10) =
           *(undefined8 *)(this->stack->stackFrame).stackPointer;
      break;
    case 0xf5:
      interpretStoreTemporalVariable(this);
      break;
    case 0xf8:
      interpretCallPrimitive(this);
      break;
    case 0xfa:
      interpretPushClosure(this);
      break;
    case 0xfb:
      interpretPushTemporaryInVector(this);
      break;
    case 0xfc:
      interpretStoreTemporalInVector(this);
      break;
    case 0xfd:
      interpretPopStoreTemporalInVector(this);
    }
    sVar16 = this->pc;
  } while( true );
}

Assistant:

void StackInterpreter::interpret()
{
	// Reset the extensions values
	extendA = 0;
	extendB = 0;
    //printf("interpret begin %d\n", pc);
	while(pc != 0)
	{
		currentOpcode = nextOpcode;
        //printf("interpret %03d. %s\n", currentOpcode, getSistaBytecodeName(currentOpcode).c_str());
		switch(currentOpcode)
		{
#define BYTECODE_DISPATCH_NAME(name) interpret ## name
#include "BytecodeSetDispatchTable.inc"
#undef BYTECODE_DISPATCH_NAME

		default:
			errorFormat("unsupported bytecode %d", currentOpcode);
		}
	}
}